

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_serialize_compact
              (secp256k1_context *ctx,uchar *output64,secp256k1_ecdsa_signature *sig)

{
  secp256k1_callback *in_RDX;
  secp256k1_scalar *in_RSI;
  secp256k1_context *in_RDI;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0x1b1,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (secp256k1_scalar *)0x0) {
    secp256k1_callback_call(in_RDX,(char *)in_stack_ffffffffffffffd8);
    local_4 = 0;
  }
  else if (in_RDX == (secp256k1_callback *)0x0) {
    secp256k1_callback_call((secp256k1_callback *)0x0,(char *)in_stack_ffffffffffffffd8);
    local_4 = 0;
  }
  else {
    secp256k1_ecdsa_signature_load
              (in_RDI,in_RSI,(secp256k1_scalar *)in_RDX,in_stack_ffffffffffffffd8);
    secp256k1_scalar_get_b32((uchar *)in_RDX,(secp256k1_scalar *)in_stack_ffffffffffffffd8);
    secp256k1_scalar_get_b32((uchar *)in_RDX,(secp256k1_scalar *)in_stack_ffffffffffffffd8);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_compact(const secp256k1_context* ctx, unsigned char *output64, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output64 != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    secp256k1_scalar_get_b32(&output64[0], &r);
    secp256k1_scalar_get_b32(&output64[32], &s);
    return 1;
}